

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

uint32_t sx_os_getpid(void)

{
  uint32_t uVar1;
  
  uVar1 = getpid();
  return uVar1;
}

Assistant:

uint32_t sx_os_getpid(void)
{
#if SX_PLATFORM_WINDOWS
    return GetCurrentProcessId();
#elif SX_PLATFORM_LINUX || SX_PLATFORM_RPI
    return (uint32_t)getpid();
#else
    return 0;
#endif
}